

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O1

int Llb_CoreReachability_int(Llb_Img_t *p,Vec_Ptr_t *vQuant0,Vec_Ptr_t *vQuant1)

{
  int *Permute;
  int *Permute_00;
  int *Permute_01;
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  void **ppvVar10;
  DdNode *n;
  abctime aVar11;
  Gia_ParLlb_t *pGVar12;
  Abc_Cex_t *pAVar13;
  long lVar14;
  abctime time;
  abctime time_00;
  abctime time_01;
  uint uVar15;
  ulong uVar16;
  int level;
  char *pcVar17;
  DdManager *pDVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  DdNode *local_88;
  timespec ts;
  
  bVar21 = p->pPars->fBackward == 0;
  bVar2 = !bVar21;
  Permute = (&p->vCs2Glo)[bVar21]->pArray;
  Permute_00 = (&p->vCs2Glo)[bVar2]->pArray;
  Permute_01 = (&p->vGlo2Cs)[bVar2]->pArray;
  iVar4 = clock_gettime(3,(timespec *)&ts);
  lVar19 = -1;
  lVar20 = -1;
  if (-1 < iVar4) {
    lVar20 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (-1 < iVar4) {
    lVar19 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pGVar12 = p->pPars;
  lVar14 = pGVar12->TimeTarget;
  if (lVar14 < lVar19) {
    if (pGVar12->fSilent == 0) {
      uVar16 = (ulong)(uint)pGVar12->TimeLimit;
      pcVar17 = "Reached timeout (%d seconds) before image computation.\n";
LAB_007d02c0:
      printf(pcVar17,uVar16);
    }
LAB_007d02c7:
    p->pPars->iFrame = -1;
  }
  else {
    p->dd->TimeStop = lVar14;
    p->ddG->TimeStop = lVar14;
    pDVar18 = p->ddR;
    pDVar18->TimeStop = lVar14;
    iVar4 = pGVar12->fBackward;
    pDVar7 = Llb_BddComputeBad(p->pInit,pDVar18,lVar14);
    if (iVar4 == 0) {
      p->ddR->bFunc = pDVar7;
      if (pDVar7 == (DdNode *)0x0) goto LAB_007d0125;
      Cudd_Ref(pDVar7);
      pDVar7 = Llb_CoreComputeCube(p->dd,p->vVarsCs,1,(char *)0x0);
      Cudd_Ref(pDVar7);
      pDVar9 = Llb_CoreComputeCube(p->ddG,p->vVarsCs,0,(char *)0x0);
      pDVar8 = pDVar9;
    }
    else {
      if (pDVar7 == (DdNode *)0x0) {
LAB_007d0125:
        if (p->pPars->fSilent == 0) {
          uVar16 = (ulong)(uint)p->pPars->TimeLimit;
          pcVar17 = "Reached timeout (%d seconds) while computing bad states.\n";
          goto LAB_007d02c0;
        }
        goto LAB_007d02c7;
      }
      Cudd_Ref(pDVar7);
      pDVar8 = Llb_CoreComputeCube(p->ddR,p->vVarsCs,0,(char *)0x0);
      p->ddR->bFunc = pDVar8;
      Cudd_Ref(pDVar8);
      pDVar9 = Llb_BddQuantifyPis(p->pInit,p->ddR,pDVar7);
      Cudd_Ref(pDVar9);
      Cudd_RecursiveDeref(p->ddR,pDVar7);
      pDVar8 = Cudd_bddTransfer(p->ddR,p->ddG,pDVar9);
      Cudd_Ref(pDVar8);
      Cudd_RecursiveDeref(p->ddR,pDVar9);
      pDVar9 = Extra_TransferPermute(p->ddG,p->dd,pDVar8,Permute_01);
      pDVar7 = pDVar9;
      if (pDVar9 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->ddG,pDVar8);
        if (p->pPars->fSilent == 0) {
          uVar16 = (ulong)(uint)p->pPars->TimeLimit;
          pcVar17 = "Reached timeout (%d seconds) during transfer 0.\n";
          goto LAB_007d02c0;
        }
        goto LAB_007d02c7;
      }
    }
    Cudd_Ref(pDVar9);
    if (p->pPars->nIterMax < 1) {
      uVar15 = 0;
    }
    else {
      uVar15 = 0;
      pDVar9 = pDVar7;
      local_88 = pDVar8;
      do {
        iVar4 = clock_gettime(3,(timespec *)&ts);
        if (iVar4 < 0) {
          lVar19 = 1;
        }
        else {
          lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        if (p->pPars->TimeLimit != 0) {
          iVar4 = clock_gettime(3,(timespec *)&ts);
          if (iVar4 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          pGVar12 = p->pPars;
          if (lVar14 <= pGVar12->TimeTarget) goto LAB_007cfd0c;
LAB_007d0321:
          if (pGVar12->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation.\n",
                   (ulong)(uint)pGVar12->TimeLimit);
          }
          p->pPars->iFrame = uVar15 - 1;
LAB_007d036b:
          pDVar18 = p->dd;
LAB_007d0433:
          Cudd_RecursiveDeref(pDVar18,pDVar9);
          pDVar18 = p->ddG;
LAB_007d0471:
          Cudd_RecursiveDeref(pDVar18,local_88);
          return -1;
        }
LAB_007cfd0c:
        pDVar7 = Extra_TransferPermute(p->dd,p->ddR,pDVar9,Permute_00);
        if (pDVar7 == (DdNode *)0x0) {
          pGVar12 = p->pPars;
          goto LAB_007d0321;
        }
        Cudd_Ref(pDVar7);
        pVVar1 = p->vRings;
        uVar5 = pVVar1->nCap;
        if (pVVar1->nSize == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar1->pArray,0x80);
            }
            pVVar1->pArray = ppvVar10;
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar5 * 2;
            if (iVar4 <= (int)uVar5) goto LAB_007cfda4;
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar1->pArray,(ulong)uVar5 << 4);
            }
            pVVar1->pArray = ppvVar10;
          }
          pVVar1->nCap = iVar4;
        }
LAB_007cfda4:
        iVar4 = pVVar1->nSize;
        pVVar1->nSize = iVar4 + 1;
        pVVar1->pArray[iVar4] = pDVar7;
        if ((p->pPars->fSkipOutCheck == 0) &&
           (iVar4 = Cudd_bddLeq(p->ddR,pDVar7,(DdNode *)((ulong)p->ddR->bFunc ^ 1)), iVar4 == 0)) {
          if (p->pInit->pSeqModel != (Abc_Cex_t *)0x0) {
            __assert_fail("p->pInit->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Core.c"
                          ,0x13e,
                          "int Llb_CoreReachability_int(Llb_Img_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
          }
          if (p->pPars->fBackward == 0) {
            pAVar13 = Llb_CoreDeriveCex(p);
            p->pInit->pSeqModel = pAVar13;
          }
          Cudd_RecursiveDeref(p->dd,pDVar9);
          pDVar18 = p->ddG;
          Cudd_RecursiveDeref(pDVar18,local_88);
          if (p->pPars->fSilent == 0) {
            if (p->pPars->fBackward == 0) {
              Abc_Print((int)pDVar18,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                        (ulong)(uint)p->pInit->pSeqModel->iPo,p->pInit->pName,(ulong)uVar15);
            }
            else {
              Abc_Print((int)pDVar18,
                        "Output ??? was asserted in frame %d (counter-example is not produced).  ",
                        (ulong)uVar15);
            }
            aVar11 = Abc_Clock();
            Abc_PrintTime(0x8ed428,(char *)(aVar11 - lVar20),time_01);
          }
          goto LAB_007d0524;
        }
        pGVar12 = p->pPars;
        pDVar7 = Llb_ImgComputeImage(p->pAig,p->vDdMans,p->dd,pDVar9,vQuant0,vQuant1,p->vDriRefs,
                                     pGVar12->TimeTarget,pGVar12->fBackward,pGVar12->fReorder,
                                     pGVar12->fVeryVerbose);
        if (pDVar7 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = uVar15 - 1;
          goto LAB_007d036b;
        }
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(p->dd,pDVar9);
        n = Extra_TransferPermute(p->dd,p->ddG,pDVar7,Permute);
        if (n == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = uVar15 - 1;
          pDVar18 = p->dd;
LAB_007d0465:
          Cudd_RecursiveDeref(pDVar18,pDVar7);
          pDVar18 = p->ddG;
          goto LAB_007d0471;
        }
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p->dd,pDVar7);
        uVar5 = Cudd_DagSize(n);
        iVar4 = Cudd_bddLeq(p->ddG,n,local_88);
        if (iVar4 != 0) {
          Cudd_RecursiveDeref(p->ddG,n);
          pDVar7 = (DdNode *)0x0;
          pDVar8 = local_88;
          break;
        }
        pDVar9 = Cudd_bddAnd(p->ddG,n,(DdNode *)((ulong)local_88 ^ 1));
        if (pDVar9 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = uVar15 - 1;
          Cudd_RecursiveDeref(p->ddG,n);
          pDVar18 = p->ddG;
          goto LAB_007d0471;
        }
        Cudd_Ref(pDVar9);
        pDVar7 = Extra_TransferPermute(p->ddG,p->dd,pDVar9,Permute_01);
        if (pDVar7 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = uVar15 - 1;
          pDVar18 = p->ddG;
          goto LAB_007d0433;
        }
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(p->ddG,pDVar9);
        pDVar8 = Cudd_bddOr(p->ddG,local_88,n);
        Cudd_Ref(pDVar8);
        Cudd_RecursiveDeref(p->ddG,local_88);
        Cudd_RecursiveDeref(p->ddG,n);
        if (p->pPars->fVeryVerbose != 0) {
          dVar22 = Cudd_CountMinterm(p->ddG,pDVar8,p->pAig->nRegs);
          pFVar3 = _stdout;
          dVar23 = ldexp(1.0,p->pAig->nRegs);
          fprintf(pFVar3,"        Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar22,
                  (dVar22 * 100.0) / dVar23);
          fflush(_stdout);
        }
        if (p->pPars->fVerbose != 0) {
          fprintf(_stdout,"F =%3d : ",(ulong)uVar15);
          fprintf(_stdout,"Image =%6d  ",(ulong)uVar5);
          pFVar3 = _stdout;
          uVar5 = Cudd_ReadReorderings(p->dd);
          uVar6 = Cudd_ReadGarbageCollections(p->dd);
          fprintf(pFVar3,"(%4d%4d)  ",(ulong)uVar5,(ulong)uVar6);
          pFVar3 = _stdout;
          uVar5 = Cudd_DagSize(pDVar8);
          fprintf(pFVar3,"Reach =%6d  ",(ulong)uVar5);
          pFVar3 = _stdout;
          uVar5 = Cudd_ReadReorderings(p->ddG);
          uVar6 = Cudd_ReadGarbageCollections(p->ddG);
          fprintf(pFVar3,"(%4d%4d)  ",(ulong)uVar5,(ulong)uVar6);
          level = 3;
          iVar4 = clock_gettime(3,(timespec *)&ts);
          if (iVar4 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(level,"%s =","Time");
          Abc_Print(level,"%9.2f sec\n",(double)(lVar14 + lVar19) / 1000000.0);
        }
        local_88 = pDVar8;
        if (uVar15 == p->pPars->nIterMax - 1U) {
          if (p->pPars->fSilent == 0) {
            printf("Reached limit on the number of timeframes (%d).\n");
          }
          p->pPars->iFrame = uVar15;
          pDVar18 = p->dd;
          goto LAB_007d0465;
        }
        uVar15 = uVar15 + 1;
        pDVar9 = pDVar7;
      } while ((int)uVar15 < p->pPars->nIterMax);
    }
    if (pDVar8 == (DdNode *)0x0) {
LAB_007d0524:
      p->pPars->iFrame = uVar15 - 1;
      return 0;
    }
    if (pDVar7 != (DdNode *)0x0) {
      Cudd_RecursiveDeref(p->dd,pDVar7);
    }
    if (p->pPars->fVerbose != 0) {
      dVar22 = Cudd_CountMinterm(p->ddG,pDVar8,p->pAig->nRegs);
      pcVar17 = "Reachability analysis is stopped after %d frames.\n";
      if ((int)uVar15 < p->pPars->nIterMax) {
        pcVar17 = "Reachability analysis completed after %d frames.\n";
      }
      fprintf(_stdout,pcVar17,(ulong)uVar15);
      pFVar3 = _stdout;
      dVar23 = ldexp(1.0,p->pAig->nRegs);
      fprintf(pFVar3,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar22,(dVar22 * 100.0) / dVar23
             );
      fflush(_stdout);
    }
    if (p->pPars->fDumpReached != 0) {
      Llb_ManDumpReached(p->ddG,pDVar8,p->pAig->pName,"reached.blif");
      uVar5 = Cudd_DagSize(pDVar8);
      printf("Reached states with %d BDD nodes are dumpted into file \"reached.blif\".\n",
             (ulong)uVar5);
    }
    Cudd_RecursiveDeref(p->ddG,pDVar8);
    iVar4 = p->pPars->fSilent;
    if ((int)uVar15 < p->pPars->nIterMax) {
      if (iVar4 == 0) {
        printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar15);
        aVar11 = Abc_Clock();
        Abc_PrintTime(0x8ed428,(char *)(aVar11 - lVar20),time);
      }
      p->pPars->iFrame = uVar15 - 1;
      return 1;
    }
    if (iVar4 == 0) {
      printf("Verified only for states reachable in %d frames.  ",(ulong)uVar15);
      aVar11 = Abc_Clock();
      Abc_PrintTime(0x8ed428,(char *)(aVar11 - lVar20),time_00);
    }
    p->pPars->iFrame = p->pPars->nIterMax;
  }
  return -1;
}

Assistant:

int Llb_CoreReachability_int( Llb_Img_t * p, Vec_Ptr_t * vQuant0, Vec_Ptr_t * vQuant1 )
{
    int * pLoc2Glo  = p->pPars->fBackward? Vec_IntArray( p->vCs2Glo ) : Vec_IntArray( p->vNs2Glo );
    int * pLoc2GloR = p->pPars->fBackward? Vec_IntArray( p->vNs2Glo ) : Vec_IntArray( p->vCs2Glo );
    int * pGlo2Loc  = p->pPars->fBackward? Vec_IntArray( p->vGlo2Ns ) : Vec_IntArray( p->vGlo2Cs );
    DdNode * bCurrent, * bReached, * bNext, * bTemp;
    abctime clk2, clk = Abc_Clock();
    int nIters, nBddSize;//, iOutFail = -1;
/*
    // compute time to stop
    if ( p->pPars->TimeLimit )
        p->pPars->TimeTarget = Abc_Clock() + p->pPars->TimeLimit * CLOCKS_PER_SEC;
    else
        p->pPars->TimeTarget = 0;
*/

    if ( Abc_Clock() > p->pPars->TimeTarget )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) before image computation.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // compute initial states
    if ( p->pPars->fBackward )
    {
        // create init state in the global manager
        bTemp = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );   
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) while computing bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( bTemp );
        // create bad state in the ring manager
        p->ddR->bFunc = Llb_CoreComputeCube( p->ddR, p->vVarsCs, 0, NULL );      Cudd_Ref( p->ddR->bFunc );
        bCurrent = Llb_BddQuantifyPis( p->pInit, p->ddR, bTemp );                Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->ddR, bTemp );
        bReached = Cudd_bddTransfer( p->ddR, p->ddG, bCurrent );                 Cudd_Ref( bReached );
        Cudd_RecursiveDeref( p->ddR, bCurrent );
        // move init state to the working manager
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bReached, pGlo2Loc );   
        if ( bCurrent == NULL )
        {
            Cudd_RecursiveDeref( p->ddG, bReached );
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during transfer 0.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( bCurrent );
    }
    else
    {
        // create bad state in the ring manager
        p->ddR->bFunc = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );  
        if ( p->ddR->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) while computing bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( p->ddR->bFunc );
        // create init state in the working and global manager
        bCurrent = Llb_CoreComputeCube( p->dd,  p->vVarsCs, 1, NULL );           Cudd_Ref( bCurrent );
        bReached = Llb_CoreComputeCube( p->ddG, p->vVarsCs, 0, NULL );           Cudd_Ref( bReached );
//Extra_bddPrint( p->dd, bCurrent );  printf( "\n" );
//Extra_bddPrint( p->ddG, bReached );  printf( "\n" );
    }

    // compute onion rings
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clk2 = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, bCurrent, pLoc2GloR );  
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pInit->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pInit->pSeqModel = Llb_CoreDeriveCex( p ); 
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pInit->pSeqModel->iPo, p->pInit->pName, nIters );
                else
                    Abc_Print( 1, "Output ??? was asserted in frame %d (counter-example is not produced).  ", nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            return 0;
        }

        // compute the next states
        bNext = Llb_ImgComputeImage( p->pAig, p->vDdMans, p->dd, bCurrent, 
            vQuant0, vQuant1, p->vDriRefs, p->pPars->TimeTarget, 
            p->pPars->fBackward, p->pPars->fReorder, p->pPars->fVeryVerbose );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );   bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bCurrent );        bCurrent = NULL;
//Extra_bddPrintSupport( p->dd, bNext ); printf( "\n" );

        // remap these states into the global manager
//        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pLoc2Glo );    Cudd_Ref( bNext );
//        Cudd_RecursiveDeref( p->dd, bTemp );

//        bNext = Extra_TransferPermuteTime( p->dd, p->ddG, bTemp = bNext, pLoc2Glo, p->pPars->TimeTarget );    
        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pLoc2Glo );    
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bTemp );  
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bTemp );  

        nBddSize = Cudd_DagSize(bNext);
        // check if there are any new states
        if ( Cudd_bddLeq( p->ddG, bNext, bReached ) ) // implication = no new states
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }

        // get the new states
        bCurrent = Cudd_bddAnd( p->ddG, bNext, Cudd_Not(bReached) );                    
        if ( bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bNext );  
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bCurrent );

        // remap these states into the current state vars
//        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Loc );   Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( p->ddG, bTemp );

//        bCurrent = Extra_TransferPermuteTime( p->ddG, p->dd, bTemp = bCurrent, pGlo2Loc, p->pPars->TimeTarget );    
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Loc );    
        if ( bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->ddG, bTemp );

        // add to the reached states
        bReached = Cudd_bddOr( p->ddG, bTemp = bReached, bNext );                       Cudd_Ref( bReached );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        Cudd_RecursiveDeref( p->ddG, bNext );
        bNext = NULL;

        if ( p->pPars->fVeryVerbose )
        {
            double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->ddG, bReached );printf( "\n" );
            fprintf( stdout, "        Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
        if ( p->pPars->fVerbose )
        {
            fprintf( stdout, "F =%3d : ",    nIters );
            fprintf( stdout, "Image =%6d  ", nBddSize );
            fprintf( stdout, "(%4d%4d)  ", 
                Cudd_ReadReorderings(p->dd),  Cudd_ReadGarbageCollections(p->dd) );
            fprintf( stdout, "Reach =%6d  ", Cudd_DagSize(bReached) );
            fprintf( stdout, "(%4d%4d)  ", 
                Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }

        // check timeframe limit
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }
    }
    if ( bReached == NULL )
    {
        p->pPars->iFrame = nIters - 1;
        return 0; // reachable
    }
    if ( bCurrent )
        Cudd_RecursiveDeref( p->dd, bCurrent );
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( p->pPars->fDumpReached )
    {
        Llb_ManDumpReached( p->ddG, bReached, p->pAig->pName, "reached.blif" );
        printf( "Reached states with %d BDD nodes are dumpted into file \"reached.blif\".\n", Cudd_DagSize(bReached) );
    }
    Cudd_RecursiveDeref( p->ddG, bReached );
    if ( nIters >= p->pPars->nIterMax )
    {
        if ( !p->pPars->fSilent )
        {
            printf( "Verified only for states reachable in %d frames.  ", nIters );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    if ( !p->pPars->fSilent )
    {
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}